

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

bool google::protobuf::compiler::objectivec::HasWKTWithObjCCategory(FileDescriptor *file)

{
  pointer __s1;
  size_type sVar1;
  bool bVar2;
  int iVar3;
  size_type __rlen;
  objectivec aoStack_28 [16];
  
  __s1 = (file->name_->_M_dataplus)._M_p;
  sVar1 = file->name_->_M_string_length;
  if (sVar1 == 0x1f) {
    iVar3 = bcmp(__s1,"google/protobuf/timestamp.proto",0x1f);
  }
  else if (sVar1 == 0x1e) {
    iVar3 = bcmp(__s1,"google/protobuf/duration.proto",0x1e);
  }
  else {
    if (sVar1 != 0x19) {
      return false;
    }
    iVar3 = bcmp(__s1,"google/protobuf/any.proto",0x19);
  }
  if (iVar3 != 0) {
    return false;
  }
  bVar2 = IsProtobufLibraryBundledProtoFile(file);
  if (!bVar2) {
    HasWKTWithObjCCategory(aoStack_28);
  }
  return true;
}

Assistant:

bool HasWKTWithObjCCategory(const FileDescriptor* file) {
  // We don't check the name prefix or proto package because some files
  // (descriptor.proto), aren't shipped generated by the library, so this
  // seems to be the safest way to only catch the ones shipped.
  const absl::string_view name = file->name();
  if (name == "google/protobuf/any.proto" ||
      name == "google/protobuf/duration.proto" ||
      name == "google/protobuf/timestamp.proto") {
    ABSL_DCHECK(IsProtobufLibraryBundledProtoFile(file));
    return true;
  }
  return false;
}